

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::ScopedFakeTestPartResultReporter::Init(ScopedFakeTestPartResultReporter *this)

{
  TestPartResultReporterInterface *pTVar1;
  ulong uVar2;
  UnitTestImpl *pUVar3;
  
  pUVar3 = internal::GetUnitTestImpl();
  uVar2 = (ulong)(this->intercept_mode_ != INTERCEPT_ALL_THREADS);
  pTVar1 = (&pUVar3->global_test_part_result_repoter_)[uVar2 * 2];
  (&pUVar3->global_test_part_result_repoter_)[uVar2 * 2] =
       &this->super_TestPartResultReporterInterface;
  this->old_reporter_ = pTVar1;
  return;
}

Assistant:

void ScopedFakeTestPartResultReporter::Init() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  if (intercept_mode_ == INTERCEPT_ALL_THREADS) {
    old_reporter_ = impl->GetGlobalTestPartResultReporter();
    impl->SetGlobalTestPartResultReporter(this);
  } else {
    old_reporter_ = impl->GetTestPartResultReporterForCurrentThread();
    impl->SetTestPartResultReporterForCurrentThread(this);
  }
}